

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

uint8 * __thiscall
caffe::TransformationParameter::InternalSerializeWithCachedSizesToArray
          (TransformationParameter *this,bool deterministic,uint8 *target)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  string *psVar4;
  void *pvVar5;
  LogMessage *other;
  Rep *pRVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  LogFinisher local_61;
  LogMessage local_60;
  
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((uVar3 & 0x20) != 0) {
    fVar1 = this->scale_;
    *target = '\r';
    *(float *)(target + 1) = fVar1;
    target = target + 5;
  }
  if ((uVar3 & 4) != 0) {
    bVar2 = this->mirror_;
    *target = 0x10;
    target[1] = bVar2;
    target = target + 2;
  }
  if ((uVar3 & 2) != 0) {
    uVar7 = this->crop_size_;
    *target = 0x18;
    pbVar11 = target + 1;
    uVar8 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar11 = (byte)uVar7 | 0x80;
        uVar8 = uVar7 >> 7;
        pbVar11 = pbVar11 + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar8;
      } while (bVar2);
    }
    *pbVar11 = (byte)uVar8;
    target = pbVar11 + 1;
  }
  if ((uVar3 & 1) != 0) {
    psVar4 = (this->mean_file_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar4->_M_dataplus)._M_p,(int)psVar4->_M_string_length,SERIALIZE,
               "caffe.TransformationParameter.mean_file");
    psVar4 = (this->mean_file_).ptr_;
    *target = 0x22;
    target = google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray(psVar4,target + 1);
  }
  uVar7 = (this->mean_value_).current_size_;
  if (uVar7 != 0) {
    pRVar6 = (this->mean_value_).rep_;
    if (pRVar6 == (Rep *)0x0) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x4e2);
      other = google::protobuf::internal::LogMessage::operator<<(&local_60,"CHECK failed: rep_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_61,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_60);
      pRVar6 = (this->mean_value_).rep_;
    }
    uVar9 = 1;
    if (1 < (int)uVar7) {
      uVar9 = (ulong)uVar7;
    }
    uVar10 = 0;
    do {
      fVar1 = pRVar6->elements[uVar10];
      *target = 0x2d;
      *(float *)(target + 1) = fVar1;
      target = target + 5;
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  if ((uVar3 & 8) != 0) {
    bVar2 = this->force_color_;
    *target = 0x30;
    target[1] = bVar2;
    target = target + 2;
  }
  if ((uVar3 & 0x10) != 0) {
    bVar2 = this->force_gray_;
    *target = 0x38;
    target[1] = bVar2;
    target = target + 2;
  }
  pvVar5 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) != 0) {
    target = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe),target);
  }
  return target;
}

Assistant:

::google::protobuf::uint8* TransformationParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.TransformationParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional float scale = 1 [default = 1];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(1, this->scale(), target);
  }

  // optional bool mirror = 2 [default = false];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->mirror(), target);
  }

  // optional uint32 crop_size = 3 [default = 0];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(3, this->crop_size(), target);
  }

  // optional string mean_file = 4;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->mean_file().data(), this->mean_file().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.TransformationParameter.mean_file");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        4, this->mean_file(), target);
  }

  // repeated float mean_value = 5;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(5, this->mean_value_, target);

  // optional bool force_color = 6 [default = false];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(6, this->force_color(), target);
  }

  // optional bool force_gray = 7 [default = false];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(7, this->force_gray(), target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.TransformationParameter)
  return target;
}